

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_open_socket(void)

{
  FILE *__stream;
  uint __errnum;
  int *piVar1;
  char *pcVar2;
  
  __errnum = socket(0x1d,2,7);
  if ((int)__errnum < 0) {
    piVar1 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar1;
    pcVar2 = strerror(__errnum);
    fprintf(__stream,"socket(j1939): %d (%s)",(ulong)__errnum,pcVar2);
  }
  return __errnum;
}

Assistant:

int libj1939_open_socket(void)
{
	int ret;

	/* Create a new CAN J1939 socket */
	ret = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (ret < 0) {
		/* Get the error code and print an error message */
		ret = -errno;
		pr_err("socket(j1939): %d (%s)", ret, strerror(ret));
		return ret;
	}
	return ret;
}